

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_errors.cc
# Opt level: O2

string * __thiscall
bssl::CertPathErrors::ToDebugString_abi_cxx11_
          (string *__return_storage_ptr__,CertPathErrors *this,ParsedCertificateList *certs)

{
  pointer pCVar1;
  pointer psVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  string cert_name_debug_str;
  string other_errors;
  RDNSequence subject;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream result;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  lVar7 = 0;
  lVar5 = 0;
  uVar6 = 0;
  while( true ) {
    pCVar1 = (this->cert_errors_).
             super__Vector_base<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->cert_errors_).
                       super__Vector_base<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x18) <= uVar6)
    break;
    CertErrors::ToDebugString_abi_cxx11_
              (&other_errors,
               (CertErrors *)
               ((long)&(pCVar1->nodes_).
                       super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_> + lVar7
               ));
    if (other_errors._M_string_length != 0) {
      cert_name_debug_str._M_dataplus._M_p = (pointer)&cert_name_debug_str.field_2;
      cert_name_debug_str._M_string_length = 0;
      cert_name_debug_str.field_2._M_local_buf[0] = '\0';
      psVar2 = (certs->
               super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((uVar6 < (ulong)((long)(certs->
                                 super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4))
         && (*(long *)((long)&(psVar2->
                              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + lVar5) != 0)) {
        subject.
        super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        subject.
        super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        subject.
        super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar3 = ParseName((Input)*(Span<const_unsigned_char> *)
                                  (*(long *)((long)&(psVar2->
                                                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar5) + 0x98),&subject);
        if (bVar3) {
          bVar3 = ConvertToRFC2253(&subject,&cert_name_debug_str);
          if (bVar3) {
            ::std::operator+(&local_1c8," (",&cert_name_debug_str);
            ::std::operator+(&local_1e8,&local_1c8,")");
            ::std::__cxx11::string::operator=((string *)&cert_name_debug_str,(string *)&local_1e8);
            ::std::__cxx11::string::~string((string *)&local_1e8);
            ::std::__cxx11::string::~string((string *)&local_1c8);
          }
        }
        ::std::
        vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
        ::~vector(&subject);
      }
      poVar4 = ::std::operator<<((ostream *)&result,"----- Certificate i=");
      poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = ::std::operator<<(poVar4,(string *)&cert_name_debug_str);
      ::std::operator<<(poVar4," -----\n");
      poVar4 = ::std::operator<<((ostream *)&result,(string *)&other_errors);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::~string((string *)&cert_name_debug_str);
    }
    ::std::__cxx11::string::~string((string *)&other_errors);
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x10;
    lVar7 = lVar7 + 0x18;
  }
  CertErrors::ToDebugString_abi_cxx11_(&other_errors,&this->other_errors_);
  if (other_errors._M_string_length != 0) {
    ::std::operator<<((ostream *)&result,"----- Other errors (not certificate specific) -----\n");
    poVar4 = ::std::operator<<((ostream *)&result,(string *)&other_errors);
    ::std::operator<<(poVar4,"\n");
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::~string((string *)&other_errors);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string CertPathErrors::ToDebugString(
    const ParsedCertificateList &certs) const {
  std::ostringstream result;

  for (size_t i = 0; i < cert_errors_.size(); ++i) {
    // Pretty print the current CertErrors. If there were no errors/warnings,
    // then continue.
    const CertErrors &errors = cert_errors_[i];
    std::string cert_errors_string = errors.ToDebugString();
    if (cert_errors_string.empty()) {
      continue;
    }

    // Add a header that identifies which certificate this CertErrors pertains
    // to.
    std::string cert_name_debug_str;
    if (i < certs.size() && certs[i]) {
      RDNSequence subject;
      if (ParseName(certs[i]->tbs().subject_tlv, &subject) &&
          ConvertToRFC2253(subject, &cert_name_debug_str)) {
        cert_name_debug_str = " (" + cert_name_debug_str + ")";
      }
    }
    result << "----- Certificate i=" << i << cert_name_debug_str << " -----\n";
    result << cert_errors_string << "\n";
  }

  // Print any other errors that aren't associated with a particular certificate
  // in the chain.
  std::string other_errors = other_errors_.ToDebugString();
  if (!other_errors.empty()) {
    result << "----- Other errors (not certificate specific) -----\n";
    result << other_errors << "\n";
  }

  return result.str();
}